

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPrerequisiteTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles2::Functional::ReadPixelsCase::iterate(ReadPixelsCase *this)

{
  int iVar1;
  deUint32 dVar2;
  GLenum err;
  PixelFormat *pPVar3;
  RenderContext *context;
  TestLog *pTVar4;
  int iVar5;
  byte local_4d9;
  deUint32 *local_4d8;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  LogImage local_438;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  LogImage local_358;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  LogImage local_278;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  LogImageSet local_198;
  TestLog *local_158;
  TestLog *log;
  deUint32 local_148;
  deUint32 local_144;
  deUint32 local_140;
  byte local_139;
  deUint32 local_138;
  RGBA RStack_134;
  bool isPixelOk;
  RGBA refRGBA;
  RGBA resRGBA;
  int i;
  int j;
  bool isImageOk;
  RGBA diffColor;
  RGBA matchColor;
  RGBA colorThreshold;
  Vector<int,_4> local_f0;
  PixelBufferAccess local_e0;
  uint local_b4;
  uint local_b0;
  int b;
  int g;
  int r;
  Surface diffImage;
  undefined1 local_80 [8];
  Surface refImage;
  Surface resImage;
  deRandom rnd;
  int imageHeight;
  int imageWidth;
  int y;
  int x;
  int targetHeight;
  int targetWidth;
  PixelFormat pixelFormat;
  RenderTarget *renderTarget;
  ReadPixelsCase *this_local;
  
  pixelFormat._8_8_ = Context::getRenderTarget((this->super_TestCase).m_context);
  pPVar3 = tcu::RenderTarget::getPixelFormat((RenderTarget *)pixelFormat._8_8_);
  targetHeight = pPVar3->redBits;
  unique0x10000689 = pPVar3->greenBits;
  pixelFormat.redBits = pPVar3->blueBits;
  pixelFormat.greenBits = pPVar3->alphaBits;
  rnd.w = tcu::RenderTarget::getWidth((RenderTarget *)pixelFormat._8_8_);
  rnd.z = tcu::RenderTarget::getHeight((RenderTarget *)pixelFormat._8_8_);
  dVar2 = deInt32Hash(this->m_curIter);
  deRandom_init((deRandom *)&resImage.m_pixels.m_cap,dVar2);
  iVar1 = this->m_curIter;
  if (iVar1 == 0) {
    imageWidth = 0;
    imageHeight = 0;
  }
  else if (iVar1 == 1) {
    imageWidth = 0;
    imageHeight = 0;
    rnd.w = (int)rnd.w / 2;
    rnd.z = (int)rnd.z / 2;
  }
  else if (iVar1 == 2) {
    imageWidth = (int)rnd.w / 2;
    imageHeight = (int)rnd.z / 2;
    rnd.w = rnd.w - imageWidth;
    rnd.z = rnd.z - imageHeight;
  }
  else {
    dVar2 = deRandom_getUint32((deRandom *)&resImage.m_pixels.m_cap);
    imageWidth = dVar2 % (rnd.w - 1);
    dVar2 = deRandom_getUint32((deRandom *)&resImage.m_pixels.m_cap);
    imageHeight = dVar2 % (rnd.z - 1);
    dVar2 = deRandom_getUint32((deRandom *)&resImage.m_pixels.m_cap);
    rnd.w = dVar2 % ((rnd.w - imageWidth) - 1) + 1;
    dVar2 = deRandom_getUint32((deRandom *)&resImage.m_pixels.m_cap);
    rnd.z = dVar2 % ((rnd.z - imageHeight) - 1) + 1;
  }
  tcu::Surface::Surface((Surface *)&refImage.m_pixels.m_cap,rnd.w,rnd.z);
  tcu::Surface::Surface((Surface *)local_80,rnd.w,rnd.z);
  tcu::Surface::Surface((Surface *)&g,rnd.w,rnd.z);
  dVar2 = deRandom_getUint32((deRandom *)&resImage.m_pixels.m_cap);
  b = dVar2 & 0xff;
  dVar2 = deRandom_getUint32((deRandom *)&resImage.m_pixels.m_cap);
  local_b0 = dVar2 & 0xff;
  dVar2 = deRandom_getUint32((deRandom *)&resImage.m_pixels.m_cap);
  local_b4 = dVar2 & 0xff;
  tcu::Surface::getAccess(&local_e0,(Surface *)local_80);
  tcu::Vector<int,_4>::Vector(&local_f0,b,local_b0,local_b4,0xff);
  tcu::clear(&local_e0,&local_f0);
  glwClearColor((float)b / 255.0,(float)(int)local_b0 / 255.0,(float)(int)local_b4 / 255.0,1.0);
  glwClear(0x4000);
  context = Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&matchColor,(Surface *)&refImage.m_pixels.m_cap);
  glu::readPixels(context,imageWidth,imageHeight,(PixelBufferAccess *)&matchColor);
  err = glwGetError();
  glu::checkError(err,"glReadPixels() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fPrerequisiteTests.cpp"
                  ,0xe8);
  diffColor = tcu::PixelFormat::getColorThreshold((PixelFormat *)&targetHeight);
  tcu::RGBA::RGBA((RGBA *)&stack0xfffffffffffffee0,0,0xff,0,0xff);
  tcu::RGBA::RGBA((RGBA *)&j,0xff,0,0,0xff);
  i._3_1_ = 1;
  for (resRGBA.m_value = 0; (int)resRGBA.m_value < (int)rnd.z; resRGBA.m_value = resRGBA.m_value + 1
      ) {
    for (refRGBA.m_value = 0; (int)refRGBA.m_value < (int)rnd.w;
        refRGBA.m_value = refRGBA.m_value + 1) {
      RStack_134 = tcu::Surface::getPixel
                             ((Surface *)&refImage.m_pixels.m_cap,refRGBA.m_value,resRGBA.m_value);
      local_140 = (deUint32)
                  tcu::Surface::getPixel((Surface *)local_80,refRGBA.m_value,resRGBA.m_value);
      local_144 = RStack_134.m_value;
      local_148 = diffColor.m_value;
      local_138 = local_140;
      local_139 = tcu::compareThreshold((RGBA)local_140,RStack_134,diffColor);
      if ((bool)local_139) {
        local_4d8 = (deUint32 *)&stack0xfffffffffffffee0;
      }
      else {
        local_4d8 = (deUint32 *)&j;
      }
      log._4_4_ = *local_4d8;
      tcu::Surface::setPixel((Surface *)&g,refRGBA.m_value,resRGBA.m_value,log._4_4_);
      local_4d9 = 0;
      if (i._3_1_ != 0) {
        local_4d9 = local_139;
      }
      i._3_1_ = local_4d9 & 1;
    }
  }
  if (i._3_1_ == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    local_158 = pTVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"Result",&local_1b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"Resulting framebuffer",&local_1e1);
    tcu::LogImageSet::LogImageSet(&local_198,&local_1b8,&local_1e0);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_198);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"Result",&local_299);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"Resulting framebuffer",&local_2c1);
    tcu::LogImage::LogImage
              (&local_278,&local_298,&local_2c0,(Surface *)&refImage.m_pixels.m_cap,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_278);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"Reference",&local_379);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"Reference image",&local_3a1);
    tcu::LogImage::LogImage
              (&local_358,&local_378,&local_3a0,(Surface *)local_80,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_358);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"DiffMask",&local_459);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_480,"Failing pixels",&local_481);
    tcu::LogImage::LogImage
              (&local_438,&local_458,&local_480,(Surface *)&g,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_438);
    tcu::TestLog::operator<<(pTVar4,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_438);
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator(&local_481);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator(&local_459);
    tcu::LogImage::~LogImage(&local_358);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator(&local_3a1);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator(&local_379);
    tcu::LogImage::~LogImage(&local_278);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
    tcu::LogImageSet::~LogImageSet(&local_198);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator(&local_1b9);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  iVar5 = this->m_curIter + 1;
  this->m_curIter = iVar5;
  iVar1 = this->m_numIters;
  tcu::Surface::~Surface((Surface *)&g);
  tcu::Surface::~Surface((Surface *)local_80);
  tcu::Surface::~Surface((Surface *)&refImage.m_pixels.m_cap);
  return (uint)(iVar5 < iVar1);
}

Assistant:

TestCase::IterateResult ReadPixelsCase::iterate (void)
{
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderTarget();
	tcu::PixelFormat			pixelFormat		= renderTarget.getPixelFormat();
	int							targetWidth		= renderTarget.getWidth();
	int							targetHeight	= renderTarget.getHeight();
	int							x				= 0;
	int							y				= 0;
	int							imageWidth		= 0;
	int							imageHeight		= 0;

	deRandom rnd;
	deRandom_init(&rnd, deInt32Hash(m_curIter));

	switch (m_curIter)
	{
		case 0:
			// Fullscreen
			x = 0;
			y = 0;
			imageWidth  = targetWidth;
			imageHeight = targetHeight;
			break;
		case 1:
			// Upper left corner
			x = 0;
			y = 0;
			imageWidth = targetWidth / 2;
			imageHeight = targetHeight / 2;
			break;
		case 2:
			// Lower right corner
			x = targetWidth / 2;
			y = targetHeight / 2;
			imageWidth = targetWidth - x;
			imageHeight = targetHeight - y;
			break;
		default:
			x = deRandom_getUint32(&rnd) % (targetWidth - 1);
			y = deRandom_getUint32(&rnd) % (targetHeight - 1);
			imageWidth = 1 + (deRandom_getUint32(&rnd) % (targetWidth - x - 1));
			imageHeight = 1 + (deRandom_getUint32(&rnd) % (targetHeight - y - 1));
			break;
	}

	Surface	resImage(imageWidth, imageHeight);
	Surface	refImage(imageWidth, imageHeight);
	Surface	diffImage(imageWidth, imageHeight);

	int r = (int)(deRandom_getUint32(&rnd) & 0xFF);
	int g = (int)(deRandom_getUint32(&rnd) & 0xFF);
	int b = (int)(deRandom_getUint32(&rnd) & 0xFF);

	tcu::clear(refImage.getAccess(), tcu::IVec4(r, g, b, 255));
	glClearColor(float(r)/255.0f, float(g)/255.0f, float(b)/255.0f, 1.0f);
	glClear(GL_COLOR_BUFFER_BIT);

	glu::readPixels(m_context.getRenderContext(), x, y, resImage.getAccess());
	GLU_CHECK_MSG("glReadPixels() failed.");

	RGBA colorThreshold = pixelFormat.getColorThreshold();
	RGBA matchColor(0, 255, 0, 255);
	RGBA diffColor(255, 0, 0, 255);
	bool isImageOk = true;

	for (int j = 0; j < imageHeight; j++)
	{
		for (int i = 0; i < imageWidth; i++)
		{
			RGBA		resRGBA		= resImage.getPixel(i, j);
			RGBA		refRGBA		= refImage.getPixel(i, j);
			bool		isPixelOk	= compareThreshold(refRGBA, resRGBA, colorThreshold);
			diffImage.setPixel(i, j, isPixelOk ? matchColor : diffColor);

			isImageOk = isImageOk && isPixelOk;
		}
	}

	if (isImageOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		TestLog& log = m_testCtx.getLog();
		log << TestLog::ImageSet("Result", "Resulting framebuffer")
			<< TestLog::Image("Result",		"Resulting framebuffer",	resImage)
			<< TestLog::Image("Reference",	"Reference image",			refImage)
			<< TestLog::Image("DiffMask",	"Failing pixels",			diffImage)
			<< TestLog::EndImageSet;
	}

	return (++m_curIter < m_numIters) ? CONTINUE : STOP;
}